

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

bool __thiscall CUI::DoButtonLogic(CUI *this,void *pID,CUIRect *pRect,int Button)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = MouseHovered(this,pRect);
  if (this->m_pActiveItem == pID) {
    this->m_ActiveItemValid = true;
    if ((DoButtonLogic::s_LastButton == Button) &&
       ((this->m_MouseButtons >> (Button & 0x1fU) & 1) == 0)) {
      this->m_pActiveItem = (void *)0x0;
      DoButtonLogic::s_LastButton = -1;
      bVar2 = bVar1;
      goto LAB_0017e37f;
    }
  }
  else if ((this->m_pHotItem == pID) && ((this->m_MouseButtons >> (Button & 0x1fU) & 1) != 0)) {
    this->m_ActiveItemValid = true;
    this->m_pActiveItem = pID;
    if (pID != (void *)0x0) {
      this->m_pLastActiveItem = pID;
    }
    DoButtonLogic::s_LastButton = Button;
    bVar2 = false;
    goto LAB_0017e37f;
  }
  bVar2 = false;
LAB_0017e37f:
  if ((bVar1) && ((this->m_MouseButtons >> (Button & 0x1fU) & 1) == 0)) {
    this->m_pBecommingHotItem = pID;
  }
  return bVar2;
}

Assistant:

bool CUI::DoButtonLogic(const void *pID, const CUIRect *pRect, int Button)
{
	// logic
	bool Clicked = false;
	static int s_LastButton = -1;
	const bool Hovered = MouseHovered(pRect);

	if(CheckActiveItem(pID))
	{
		if(s_LastButton == Button && !MouseButton(s_LastButton))
		{
			if(Hovered)
				Clicked = true;
			SetActiveItem(0);
			s_LastButton = -1;
		}
	}
	else if(HotItem() == pID)
	{
		if(MouseButton(Button))
		{
			SetActiveItem(pID);
			s_LastButton = Button;
		}
	}

	if(Hovered && !MouseButton(Button))
		SetHotItem(pID);

	return Clicked;
}